

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O1

void __thiscall sznet::net::Channel::~Channel(Channel *this)

{
  _Atomic_word *p_Var1;
  _Manager_type p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  int iVar5;
  
  if (this->m_eventHandling == true) {
    __assert_fail("!m_eventHandling",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Channel.cpp"
                  ,0x1b,"sznet::net::Channel::~Channel()");
  }
  if (this->m_addedToLoop != true) {
    bVar4 = EventLoop::isInLoopThread(this->m_loop);
    if (bVar4) {
      bVar4 = EventLoop::hasChannel(this->m_loop,this);
      if (bVar4) {
        __assert_fail("!m_loop->hasChannel(this)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Channel.cpp"
                      ,0x1f,"sznet::net::Channel::~Channel()");
      }
    }
    p_Var2 = (this->m_errorCallback).super__Function_base._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      (*p_Var2)((_Any_data *)&this->m_errorCallback,(_Any_data *)&this->m_errorCallback,
                __destroy_functor);
    }
    p_Var2 = (this->m_closeCallback).super__Function_base._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      (*p_Var2)((_Any_data *)&this->m_closeCallback,(_Any_data *)&this->m_closeCallback,
                __destroy_functor);
    }
    p_Var2 = (this->m_writeCallback).super__Function_base._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      (*p_Var2)((_Any_data *)&this->m_writeCallback,(_Any_data *)&this->m_writeCallback,
                __destroy_functor);
    }
    p_Var2 = (this->m_readCallback).super__Function_base._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      (*p_Var2)((_Any_data *)&this->m_readCallback,(_Any_data *)&this->m_readCallback,
                __destroy_functor);
    }
    p_Var3 = (this->m_tie).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &p_Var3->_M_weak_count;
        iVar5 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = p_Var3->_M_weak_count;
        p_Var3->_M_weak_count = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (*p_Var3->_vptr__Sp_counted_base[3])();
        return;
      }
    }
    return;
  }
  __assert_fail("!m_addedToLoop",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Channel.cpp"
                ,0x1c,"sznet::net::Channel::~Channel()");
}

Assistant:

Channel::~Channel()
{
	assert(!m_eventHandling);
	assert(!m_addedToLoop);
	if (m_loop->isInLoopThread())
	{
		assert(!m_loop->hasChannel(this));
	}
}